

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

oonf_layer2_net * oonf_layer2_net_add(char *ifname)

{
  long lVar1;
  oonf_layer2_net *ptr;
  
  if (ifname != (char *)0x0) {
    lVar1 = avl_find(&_oonf_layer2_net_tree,ifname);
    if (lVar1 != 0) {
      return (oonf_layer2_net *)(lVar1 + -0x7a0);
    }
    ptr = (oonf_layer2_net *)oonf_class_malloc(&_l2network_class);
    if (ptr != (oonf_layer2_net *)0x0) {
      strscpy(ptr,ifname,0x10);
      (ptr->_node).key = ptr;
      avl_insert(&_oonf_layer2_net_tree,&ptr->_node);
      lVar1 = 0;
      avl_init(&ptr->neighbors,oonf_layer2_avlcmp_neigh_key,0);
      avl_init(&ptr->local_peer_ips,avl_comp_netaddr,0);
      avl_init(&ptr->remote_neighbor_ips,avl_comp_netaddr,1);
      (ptr->if_listener).name = (char *)ptr;
      os_interface_linux_add(&ptr->if_listener);
      do {
        *(char **)((long)&ptr->data[0]._meta + lVar1) = _metadata_net[0].key + lVar1;
        lVar1 = lVar1 + 0x28;
      } while (lVar1 != 0x280);
      lVar1 = 0;
      do {
        *(char **)((long)&ptr->neighdata[0]._meta + lVar1) = _metadata_neigh[0].key + lVar1;
        lVar1 = lVar1 + 0x28;
      } while (lVar1 != 0x410);
      oonf_class_event(&_l2network_class,ptr,OONF_OBJECT_ADDED);
      return ptr;
    }
  }
  return (oonf_layer2_net *)0x0;
}

Assistant:

struct oonf_layer2_net *
oonf_layer2_net_add(const char *ifname) {
  struct oonf_layer2_net *l2net;
  enum oonf_layer2_network_index netidx;
  enum oonf_layer2_neighbor_index neighidx;

  if (!ifname) {
    return NULL;
  }

  l2net = avl_find_element(&_oonf_layer2_net_tree, ifname, l2net, _node);
  if (l2net) {
    return l2net;
  }

  l2net = oonf_class_malloc(&_l2network_class);
  if (!l2net) {
    return NULL;
  }

  /* initialize key */
  strscpy(l2net->name, ifname, sizeof(l2net->name));

  /* add to global l2net tree */
  l2net->_node.key = l2net->name;
  avl_insert(&_oonf_layer2_net_tree, &l2net->_node);

  /* initialize tree of neighbors, ips and proxies */
  avl_init(&l2net->neighbors, oonf_layer2_avlcmp_neigh_key, false);
  avl_init(&l2net->local_peer_ips, avl_comp_netaddr, false);
  avl_init(&l2net->remote_neighbor_ips, avl_comp_netaddr, true);

  /* initialize interface listener */
  l2net->if_listener.name = l2net->name;
  os_interface_add(&l2net->if_listener);

  /* initialize data sections */
  for (netidx=0; netidx<OONF_LAYER2_NET_COUNT; netidx++) {
    l2net->data[netidx]._meta = oonf_layer2_net_metadata_get(netidx);
  }
  for (neighidx=0; neighidx<OONF_LAYER2_NEIGH_COUNT; neighidx++) {
    l2net->neighdata[neighidx]._meta = oonf_layer2_neigh_metadata_get(neighidx);
  }

  oonf_class_event(&_l2network_class, l2net, OONF_OBJECT_ADDED);

  return l2net;
}